

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddImplicitLinkInfo(cmComputeLinkInformation *this,string *lang)

{
  undefined8 uVar1;
  char *pcVar2;
  size_t sVar3;
  iterator iVar4;
  string *i;
  key_type *__k;
  string dirVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libsVec;
  string libVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirsVec;
  string local_a8;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_68._M_allocated_capacity = (size_type)&local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_","");
  std::__cxx11::string::_M_append(local_68._M_local_buf,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append(local_68._M_local_buf);
  pcVar2 = cmMakefile::GetDefinition(this->Makefile,(string *)&local_68);
  if (pcVar2 != (char *)0x0) {
    local_88._0_8_ = (key_type *)0x0;
    local_88._8_8_ = (key_type *)0x0;
    local_88._16_8_ = (pointer)0x0;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,pcVar2,pcVar2 + sVar3);
    cmSystemTools::ExpandListArgument
              (&local_a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    uVar1 = local_88._8_8_;
    if (local_88._0_8_ != local_88._8_8_) {
      __k = (key_type *)local_88._0_8_;
      do {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&(this->ImplicitLinkLibs)._M_t,__k);
        if ((_Rb_tree_header *)iVar4._M_node ==
            &(this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header) {
          AddItem(this,__k,(cmGeneratorTarget *)0x0);
        }
        __k = __k + 1;
      } while (__k != (key_type *)uVar1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_88);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_a8);
  pcVar2 = cmMakefile::GetDefinition(this->Makefile,&local_a8);
  if (pcVar2 != (char *)0x0) {
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._0_8_ = (key_type *)(local_88 + 0x10);
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,pcVar2,pcVar2 + sVar3);
    cmSystemTools::ExpandListArgument((string *)local_88,&local_48,false);
    if ((key_type *)local_88._0_8_ != (key_type *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
    }
    cmOrderDirectories::AddLanguageDirectories(this->OrderLinkerSearchPath,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_allocated_capacity != &local_58) {
    operator_delete((void *)local_68._M_allocated_capacity,local_58._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddImplicitLinkInfo(std::string const& lang)
{
  // Add libraries for this language that are not implied by the
  // linker language.
  std::string libVar = "CMAKE_";
  libVar += lang;
  libVar += "_IMPLICIT_LINK_LIBRARIES";
  if (const char* libs = this->Makefile->GetDefinition(libVar)) {
    std::vector<std::string> libsVec;
    cmSystemTools::ExpandListArgument(libs, libsVec);
    for (std::string const& i : libsVec) {
      if (this->ImplicitLinkLibs.find(i) == this->ImplicitLinkLibs.end()) {
        this->AddItem(i, nullptr);
      }
    }
  }

  // Add linker search paths for this language that are not
  // implied by the linker language.
  std::string dirVar = "CMAKE_";
  dirVar += lang;
  dirVar += "_IMPLICIT_LINK_DIRECTORIES";
  if (const char* dirs = this->Makefile->GetDefinition(dirVar)) {
    std::vector<std::string> dirsVec;
    cmSystemTools::ExpandListArgument(dirs, dirsVec);
    this->OrderLinkerSearchPath->AddLanguageDirectories(dirsVec);
  }
}